

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

bool ASDCP::MXF::decode_mca_string
               (string *s,mca_label_map_t *labels,Dictionary *dict,string *language,
               InterchangeObject_list_t *descriptor_list,ui32_t *channel_count)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  pointer ppVar4;
  ulong uVar5;
  pointer ppVar6;
  ILogSink *pIVar7;
  undefined8 uVar8;
  AudioChannelLabelSubDescriptor *pAVar9;
  char *pcVar10;
  AudioChannelLabelSubDescriptor *local_380;
  ISO8String local_378;
  UTF16String local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  ui32_t local_304;
  AudioChannelLabelSubDescriptor *local_300;
  AudioChannelLabelSubDescriptor *channel_descr_2;
  _Self local_2f0;
  const_iterator i_4;
  ISO8String local_2e0;
  ISO8String local_2b8;
  UTF16String local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  ui32_t local_244;
  AudioChannelLabelSubDescriptor *local_240;
  AudioChannelLabelSubDescriptor *channel_descr_1;
  _Self local_230;
  const_iterator i_3;
  ISO8String local_220;
  UTF16String local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  ui32_t local_1ac;
  AudioChannelLabelSubDescriptor *local_1a8;
  AudioChannelLabelSubDescriptor *channel_descr;
  _Self local_198;
  const_iterator i_2;
  ISO8String local_188;
  UTF16String local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  iterator local_118;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>
  local_110;
  iterator local_108;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>
  local_100;
  const_iterator ui;
  _Self local_f0;
  const_iterator i_1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  size_t local_d0;
  undefined1 local_c8 [8];
  sfg_map_t used_soundfields;
  const_iterator i;
  SoundfieldGroupLabelSubDescriptor *prev_soundfield;
  SoundfieldGroupLabelSubDescriptor *current_soundfield;
  string current_language;
  string symbol_buf;
  ui32_t *channel_count_local;
  InterchangeObject_list_t *descriptor_list_local;
  string *language_local;
  Dictionary *dict_local;
  mca_label_map_t *labels_local;
  string *s_local;
  
  std::__cxx11::string::string((string *)(current_language.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&current_soundfield);
  *channel_count = 0;
  prev_soundfield = (SoundfieldGroupLabelSubDescriptor *)0x0;
  i._M_current = (char *)0x0;
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::__normal_iterator((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&used_soundfields._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>_>
  ::map((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>_>
         *)local_c8);
  local_d0 = std::__cxx11::string::begin();
  used_soundfields._M_t._M_impl.super__Rb_tree_header._M_node_count = local_d0;
  while( true ) {
    local_d8._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&used_soundfields._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       &local_d8);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&used_soundfields._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (*pcVar3 == '(') {
      if ((prev_soundfield == (SoundfieldGroupLabelSubDescriptor *)0x0) ||
         (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
        if (prev_soundfield != (SoundfieldGroupLabelSubDescriptor *)0x0) {
          pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error
                    (pIVar7,"Encountered \'(\', already processing a soundfield group.\n");
          s_local._7_1_ = false;
          goto LAB_00240069;
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          local_f0._M_node =
               (_Base_ptr)
               std::
               map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
               ::find(labels,(key_type *)((long)&current_language.field_2 + 8));
          ui._M_node = (_Base_ptr)
                       std::
                       map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
                       ::end(labels);
          bVar1 = std::operator==(&local_f0,(_Self *)&ui);
          if (bVar1) {
            pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
            uVar8 = std::__cxx11::string::c_str();
            Kumu::ILogSink::Error(pIVar7,"Unknown symbol: \'%s\'\n",uVar8);
            s_local._7_1_ = false;
            goto LAB_00240069;
          }
          ppVar6 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
                   ::operator->(&local_f0);
          bVar1 = ul_is_an_mca_group(&(ppVar6->second).ul);
          if (!bVar1) {
            pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
            uVar8 = std::__cxx11::string::c_str();
            Kumu::ILogSink::Error(pIVar7,"Not a soundfield group symbol: \'%s\'\n",uVar8);
            s_local._7_1_ = false;
            goto LAB_00240069;
          }
          local_108._M_node =
               (_Base_ptr)
               std::
               map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>_>
               ::find((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>_>
                       *)local_c8,(key_type *)((long)&current_language.field_2 + 8));
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>
          ::_Rb_tree_const_iterator(&local_100,&local_108);
          local_118._M_node =
               (_Base_ptr)
               std::
               map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>_>
               ::end((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>_>
                      *)local_c8);
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>
          ::_Rb_tree_const_iterator(&local_110,&local_118);
          bVar1 = std::operator!=(&local_100,&local_110);
          if (bVar1) {
            ppVar4 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>
                     ::operator->(&local_100);
            prev_soundfield = ppVar4->second;
          }
          else {
            i._M_current = (char *)operator_new(0x318);
            SoundfieldGroupLabelSubDescriptor::SoundfieldGroupLabelSubDescriptor
                      ((SoundfieldGroupLabelSubDescriptor *)i._M_current,dict);
            Kumu::GenRandomValue
                      (&(((SoundfieldGroupLabelSubDescriptor *)i._M_current)->
                        super_MCALabelSubDescriptor).MCALinkID);
            ppVar6 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
                     ::operator->(&local_f0);
            pcVar10 = "";
            if (((ppVar6->second).requires_prefix & 1U) != 0) {
              pcVar10 = "sg";
            }
            ppVar6 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
                     ::operator->(&local_f0);
            std::operator+(&local_138,pcVar10,&ppVar6->first);
            UTF16String::operator=
                      (&(((SoundfieldGroupLabelSubDescriptor *)i._M_current)->
                        super_MCALabelSubDescriptor).MCATagSymbol,&local_138);
            std::__cxx11::string::~string((string *)&local_138);
            ppVar6 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
                     ::operator->(&local_f0);
            UTF16String::UTF16String(&local_160,&(ppVar6->second).tag_name);
            optional_property<ASDCP::MXF::UTF16String>::operator=
                      (&(((SoundfieldGroupLabelSubDescriptor *)i._M_current)->
                        super_MCALabelSubDescriptor).MCATagName,&local_160);
            UTF16String::~UTF16String(&local_160);
            ISO8String::ISO8String(&local_188,language);
            optional_property<ASDCP::MXF::ISO8String>::operator=
                      (&(((SoundfieldGroupLabelSubDescriptor *)i._M_current)->
                        super_MCALabelSubDescriptor).RFC5646SpokenLanguage,&local_188);
            ISO8String::~ISO8String(&local_188);
            ppVar6 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
                     ::operator->(&local_f0);
            UL::operator=(&(((SoundfieldGroupLabelSubDescriptor *)i._M_current)->
                           super_MCALabelSubDescriptor).MCALabelDictionaryID,&(ppVar6->second).ul);
            i_2._M_node = (_Base_ptr)i._M_current;
            std::__cxx11::
            list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
            ::push_back(descriptor_list,(value_type *)&i_2);
            prev_soundfield = (SoundfieldGroupLabelSubDescriptor *)i._M_current;
          }
          std::__cxx11::string::clear();
        }
        else {
          if (i._M_current == (char *)0x0) {
            pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
            Kumu::ILogSink::Error
                      (pIVar7,"Encountered \'(\', without leading soundfield group symbol.\n");
            s_local._7_1_ = false;
            goto LAB_00240069;
          }
          prev_soundfield = (SoundfieldGroupLabelSubDescriptor *)i._M_current;
        }
      }
    }
    else {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&used_soundfields._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (*pcVar3 == ')') {
        if (prev_soundfield == (SoundfieldGroupLabelSubDescriptor *)0x0) {
          pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error
                    (pIVar7,"Encountered \')\', not currently processing a soundfield group.\n");
          s_local._7_1_ = false;
          goto LAB_00240069;
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error(pIVar7,"Soundfield group description contains no channels.\n");
          s_local._7_1_ = false;
          goto LAB_00240069;
        }
        local_198._M_node =
             (_Base_ptr)
             std::
             map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
             ::find(labels,(key_type *)((long)&current_language.field_2 + 8));
        channel_descr =
             (AudioChannelLabelSubDescriptor *)
             std::
             map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
             ::end(labels);
        bVar1 = std::operator==(&local_198,(_Self *)&channel_descr);
        if (bVar1) {
          pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
          uVar8 = std::__cxx11::string::c_str();
          Kumu::ILogSink::Error(pIVar7,"Unknown symbol: \'%s\'\n",uVar8);
          s_local._7_1_ = false;
          goto LAB_00240069;
        }
        if (prev_soundfield == (SoundfieldGroupLabelSubDescriptor *)0x0) {
          __assert_fail("current_soundfield",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                        ,0x6ed,
                        "bool ASDCP::MXF::decode_mca_string(const std::string &, const mca_label_map_t &, const Dictionary *, const std::string &, InterchangeObject_list_t &, ui32_t &)"
                       );
        }
        pAVar9 = (AudioChannelLabelSubDescriptor *)operator_new(0x318);
        AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor(pAVar9,dict);
        local_1a8 = pAVar9;
        Kumu::GenRandomValue(&(pAVar9->super_MCALabelSubDescriptor).MCALinkID);
        optional_property<Kumu::UUID>::operator=
                  (&local_1a8->SoundfieldGroupLinkID,
                   &(prev_soundfield->super_MCALabelSubDescriptor).MCALinkID);
        local_1ac = *channel_count + 1;
        *channel_count = local_1ac;
        optional_property<unsigned_int>::operator=
                  (&(local_1a8->super_MCALabelSubDescriptor).MCAChannelID,&local_1ac);
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
                 ::operator->(&local_198);
        pcVar10 = "";
        if (((ppVar6->second).requires_prefix & 1U) != 0) {
          pcVar10 = "ch";
        }
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
                 ::operator->(&local_198);
        std::operator+(&local_1d0,pcVar10,&ppVar6->first);
        UTF16String::operator=(&(local_1a8->super_MCALabelSubDescriptor).MCATagSymbol,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
                 ::operator->(&local_198);
        UTF16String::UTF16String(&local_1f8,&(ppVar6->second).tag_name);
        optional_property<ASDCP::MXF::UTF16String>::operator=
                  (&(local_1a8->super_MCALabelSubDescriptor).MCATagName,&local_1f8);
        UTF16String::~UTF16String(&local_1f8);
        ISO8String::ISO8String(&local_220,language);
        optional_property<ASDCP::MXF::ISO8String>::operator=
                  (&(local_1a8->super_MCALabelSubDescriptor).RFC5646SpokenLanguage,&local_220);
        ISO8String::~ISO8String(&local_220);
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
                 ::operator->(&local_198);
        UL::operator=(&(local_1a8->super_MCALabelSubDescriptor).MCALabelDictionaryID,
                      &(ppVar6->second).ul);
        i_3._M_node = (_Base_ptr)local_1a8;
        std::__cxx11::
        list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
        push_back(descriptor_list,(value_type *)&i_3);
        std::__cxx11::string::clear();
        prev_soundfield = (SoundfieldGroupLabelSubDescriptor *)0x0;
      }
      else {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&used_soundfields._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if (*pcVar3 == ':') {
          iVar2 = std::__cxx11::string::compare(current_language.field_2._M_local_buf + 8);
          if (iVar2 != 0) {
            pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
            Kumu::ILogSink::Error
                      (pIVar7,"Channel specific language may only be used with SLVS tag\n");
            s_local._7_1_ = false;
            goto LAB_00240069;
          }
          pcVar3 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&used_soundfields._M_t._M_impl.super__Rb_tree_header._M_node_count
                              );
          std::__cxx11::string::operator+=((string *)&current_soundfield,*pcVar3);
        }
        else {
          pcVar3 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&used_soundfields._M_t._M_impl.super__Rb_tree_header._M_node_count
                              );
          if (*pcVar3 == ',') {
            uVar5 = std::__cxx11::string::empty();
            if (((uVar5 & 1) == 0) &&
               (iVar2 = std::__cxx11::string::compare(current_language.field_2._M_local_buf + 8),
               iVar2 == 0)) {
              *channel_count = *channel_count + 1;
              std::__cxx11::string::clear();
            }
            else {
              uVar5 = std::__cxx11::string::empty();
              if ((uVar5 & 1) == 0) {
                local_230._M_node =
                     (_Base_ptr)
                     std::
                     map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
                     ::find(labels,(key_type *)((long)&current_language.field_2 + 8));
                channel_descr_1 =
                     (AudioChannelLabelSubDescriptor *)
                     std::
                     map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
                     ::end(labels);
                bVar1 = std::operator==(&local_230,(_Self *)&channel_descr_1);
                if (bVar1) {
                  pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
                  uVar8 = std::__cxx11::string::c_str();
                  Kumu::ILogSink::Error(pIVar7,"Unknown symbol: \'%s\'\n",uVar8);
                  s_local._7_1_ = false;
                  goto LAB_00240069;
                }
                ppVar6 = std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
                         ::operator->(&local_230);
                bVar1 = ul_is_an_mca_channel(&(ppVar6->second).ul);
                if (!bVar1) {
                  pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
                  uVar8 = std::__cxx11::string::c_str();
                  Kumu::ILogSink::Error(pIVar7,"Not a channel symbol: \'%s\'\n",uVar8);
                  s_local._7_1_ = false;
                  goto LAB_00240069;
                }
                pAVar9 = (AudioChannelLabelSubDescriptor *)operator_new(0x318);
                AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor(pAVar9,dict);
                local_240 = pAVar9;
                Kumu::GenRandomValue(&(pAVar9->super_MCALabelSubDescriptor).MCALinkID);
                if (prev_soundfield != (SoundfieldGroupLabelSubDescriptor *)0x0) {
                  optional_property<Kumu::UUID>::operator=
                            (&local_240->SoundfieldGroupLinkID,
                             &(prev_soundfield->super_MCALabelSubDescriptor).MCALinkID);
                }
                local_244 = *channel_count + 1;
                *channel_count = local_244;
                optional_property<unsigned_int>::operator=
                          (&(local_240->super_MCALabelSubDescriptor).MCAChannelID,&local_244);
                ppVar6 = std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
                         ::operator->(&local_230);
                pcVar10 = "";
                if (((ppVar6->second).requires_prefix & 1U) != 0) {
                  pcVar10 = "ch";
                }
                ppVar6 = std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
                         ::operator->(&local_230);
                std::operator+(&local_268,pcVar10,&ppVar6->first);
                UTF16String::operator=
                          (&(local_240->super_MCALabelSubDescriptor).MCATagSymbol,&local_268);
                std::__cxx11::string::~string((string *)&local_268);
                ppVar6 = std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
                         ::operator->(&local_230);
                UTF16String::UTF16String(&local_290,&(ppVar6->second).tag_name);
                optional_property<ASDCP::MXF::UTF16String>::operator=
                          (&(local_240->super_MCALabelSubDescriptor).MCATagName,&local_290);
                UTF16String::~UTF16String(&local_290);
                uVar5 = std::__cxx11::string::empty();
                if ((uVar5 & 1) == 0) {
                  ISO8String::ISO8String(&local_2e0,(string *)&current_soundfield);
                  optional_property<ASDCP::MXF::ISO8String>::operator=
                            (&(local_240->super_MCALabelSubDescriptor).RFC5646SpokenLanguage,
                             &local_2e0);
                  ISO8String::~ISO8String(&local_2e0);
                }
                else {
                  ISO8String::ISO8String(&local_2b8,language);
                  optional_property<ASDCP::MXF::ISO8String>::operator=
                            (&(local_240->super_MCALabelSubDescriptor).RFC5646SpokenLanguage,
                             &local_2b8);
                  ISO8String::~ISO8String(&local_2b8);
                }
                ppVar6 = std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
                         ::operator->(&local_230);
                UL::operator=(&(local_240->super_MCALabelSubDescriptor).MCALabelDictionaryID,
                              &(ppVar6->second).ul);
                i_4._M_node = (_Base_ptr)local_240;
                std::__cxx11::
                list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                ::push_back(descriptor_list,(value_type *)&i_4);
                std::__cxx11::string::clear();
                std::__cxx11::string::clear();
              }
            }
          }
          else {
            pcVar3 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&used_soundfields._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count);
            if (*pcVar3 != '-') {
              pcVar3 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&used_soundfields._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
              iVar2 = isalnum((int)*pcVar3);
              if (iVar2 == 0) {
                pcVar3 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&used_soundfields._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count);
                iVar2 = isspace((int)*pcVar3);
                if (iVar2 != 0) goto LAB_0023fc94;
                pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
                pcVar3 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&used_soundfields._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count);
                Kumu::ILogSink::Error
                          (pIVar7,"Unexpected character \'%c\'.\n",(ulong)(uint)(int)*pcVar3);
                s_local._7_1_ = false;
                goto LAB_00240069;
              }
            }
            uVar5 = std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              iVar2 = std::__cxx11::string::compare((char *)&current_soundfield);
              if (iVar2 == 0) {
                std::__cxx11::string::clear();
              }
              pcVar3 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&used_soundfields._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
              std::__cxx11::string::operator+=((string *)&current_soundfield,*pcVar3);
            }
            else {
              pcVar3 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&used_soundfields._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
              std::__cxx11::string::operator+=
                        ((string *)(current_language.field_2._M_local_buf + 8),*pcVar3);
            }
          }
        }
      }
    }
LAB_0023fc94:
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&used_soundfields._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  uVar5 = std::__cxx11::string::empty();
  if (((uVar5 & 1) == 0) &&
     (iVar2 = std::__cxx11::string::compare(current_language.field_2._M_local_buf + 8), iVar2 == 0))
  {
    *channel_count = *channel_count + 1;
  }
  else {
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      local_2f0._M_node =
           (_Base_ptr)
           std::
           map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
           ::find(labels,(key_type *)((long)&current_language.field_2 + 8));
      channel_descr_2 =
           (AudioChannelLabelSubDescriptor *)
           std::
           map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
           ::end(labels);
      bVar1 = std::operator==(&local_2f0,(_Self *)&channel_descr_2);
      if (bVar1) {
        pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
        uVar8 = std::__cxx11::string::c_str();
        Kumu::ILogSink::Error(pIVar7,"Unknown symbol: \'%s\'\n",uVar8);
        s_local._7_1_ = false;
        goto LAB_00240069;
      }
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
               ::operator->(&local_2f0);
      bVar1 = ul_is_an_mca_channel(&(ppVar6->second).ul);
      if (!bVar1) {
        pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
        uVar8 = std::__cxx11::string::c_str();
        Kumu::ILogSink::Error(pIVar7,"Not a channel symbol: \'%s\'\n",uVar8);
        s_local._7_1_ = false;
        goto LAB_00240069;
      }
      pAVar9 = (AudioChannelLabelSubDescriptor *)operator_new(0x318);
      AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor(pAVar9,dict);
      local_300 = pAVar9;
      Kumu::GenRandomValue(&(pAVar9->super_MCALabelSubDescriptor).MCALinkID);
      if (prev_soundfield != (SoundfieldGroupLabelSubDescriptor *)0x0) {
        optional_property<Kumu::UUID>::operator=
                  (&local_300->SoundfieldGroupLinkID,
                   &(prev_soundfield->super_MCALabelSubDescriptor).MCALinkID);
      }
      local_304 = *channel_count + 1;
      *channel_count = local_304;
      optional_property<unsigned_int>::operator=
                (&(local_300->super_MCALabelSubDescriptor).MCAChannelID,&local_304);
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
               ::operator->(&local_2f0);
      pcVar10 = "";
      if (((ppVar6->second).requires_prefix & 1U) != 0) {
        pcVar10 = "ch";
      }
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
               ::operator->(&local_2f0);
      std::operator+(&local_328,pcVar10,&ppVar6->first);
      UTF16String::operator=(&(local_300->super_MCALabelSubDescriptor).MCATagSymbol,&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
               ::operator->(&local_2f0);
      UTF16String::UTF16String(&local_350,&(ppVar6->second).tag_name);
      optional_property<ASDCP::MXF::UTF16String>::operator=
                (&(local_300->super_MCALabelSubDescriptor).MCATagName,&local_350);
      UTF16String::~UTF16String(&local_350);
      ISO8String::ISO8String(&local_378,language);
      optional_property<ASDCP::MXF::ISO8String>::operator=
                (&(local_300->super_MCALabelSubDescriptor).RFC5646SpokenLanguage,&local_378);
      ISO8String::~ISO8String(&local_378);
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>
               ::operator->(&local_2f0);
      UL::operator=(&(local_300->super_MCALabelSubDescriptor).MCALabelDictionaryID,
                    &(ppVar6->second).ul);
      local_380 = local_300;
      std::__cxx11::
      list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
      push_back(descriptor_list,(value_type *)&local_380);
    }
  }
  s_local._7_1_ = true;
LAB_00240069:
  i_1._M_node._0_4_ = 1;
  std::
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>_>
  ::~map((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>_>
          *)local_c8);
  std::__cxx11::string::~string((string *)&current_soundfield);
  std::__cxx11::string::~string((string *)(current_language.field_2._M_local_buf + 8));
  return s_local._7_1_;
}

Assistant:

bool
ASDCP::MXF::decode_mca_string(const std::string& s, const mca_label_map_t& labels, const Dictionary* dict, const std::string& language,
			      InterchangeObject_list_t& descriptor_list, ui32_t& channel_count)
{
  typedef std::map<const std::string, ASDCP::MXF::SoundfieldGroupLabelSubDescriptor *, ci_comp> sfg_map_t;
  std::string symbol_buf;
  std::string current_language;
  channel_count = 0;
  ASDCP::MXF::SoundfieldGroupLabelSubDescriptor *current_soundfield = 0, *prev_soundfield = 0;
  std::string::const_iterator i;
  sfg_map_t used_soundfields; /* Track old soundfields, so that they can be reused. This allows
                                 for the following type of layout:
                                 71(L,R,C,LFE,Lss,Rss),HI,VIN,-,-,71(Lrs,Rrs),DBOX,-  */

  for ( i = s.begin(); i != s.end(); ++i )
    {
      if ( *i == '(' )
	{
	  if ( current_soundfield != 0 && symbol_buf.empty() )
	    {
	      // appending to the existing soundfield group
	      continue;
	    }
	  else if ( current_soundfield != 0 )
	    {
	      DefaultLogSink().Error("Encountered '(', already processing a soundfield group.\n");
	      return false;
	    }
	  else if ( symbol_buf.empty() )
	    {
	      if ( prev_soundfield != 0 )
		{
		  current_soundfield = prev_soundfield;
		  // appending to the existing soundfield group
		  continue;
		}
	      else
		{
		  DefaultLogSink().Error("Encountered '(', without leading soundfield group symbol.\n");
		  return false;
		}
	    }

	  mca_label_map_t::const_iterator i = labels.find(symbol_buf);

	  if ( i == labels.end() )
	    {
	      DefaultLogSink().Error("Unknown symbol: '%s'\n", symbol_buf.c_str());
	      return false;
	    }
      
	  if ( ! ul_is_an_mca_group(i->second.ul) )
	    {
	      DefaultLogSink().Error("Not a soundfield group symbol: '%s'\n", symbol_buf.c_str());
	      return false;
	    }

	  sfg_map_t::const_iterator ui = used_soundfields.find(symbol_buf);
	  if ( ui != used_soundfields.end() )
	    {
	      current_soundfield = ui->second;  // reuse the old soundfield.
	    }
	  else
	    {
	      current_soundfield = new ASDCP::MXF::SoundfieldGroupLabelSubDescriptor(dict);
	      GenRandomValue(current_soundfield->MCALinkID);

	      current_soundfield->MCATagSymbol = (i->second.requires_prefix ? "sg" : "") + i->first;
	      current_soundfield->MCATagName = i->second.tag_name;
	      current_soundfield->RFC5646SpokenLanguage = language;
	      current_soundfield->MCALabelDictionaryID = i->second.ul;
	      descriptor_list.push_back(reinterpret_cast<ASDCP::MXF::InterchangeObject*>(current_soundfield));
	      prev_soundfield = current_soundfield;
	    }
	  symbol_buf.clear();
	}
      else if ( *i == ')' )
	{
	  if ( current_soundfield == 0 )
	    {
	      DefaultLogSink().Error("Encountered ')', not currently processing a soundfield group.\n");
	      return false;
	    }

	  if ( symbol_buf.empty() )
	    {
	      DefaultLogSink().Error("Soundfield group description contains no channels.\n");
	      return false;
	    }

	  mca_label_map_t::const_iterator i = labels.find(symbol_buf);
      
	  if ( i == labels.end() )
	    {
	      DefaultLogSink().Error("Unknown symbol: '%s'\n", symbol_buf.c_str());
	      return false;
	    }

	  assert(current_soundfield);

	  ASDCP::MXF::AudioChannelLabelSubDescriptor *channel_descr =
	    new ASDCP::MXF::AudioChannelLabelSubDescriptor(dict);
	  GenRandomValue(channel_descr->MCALinkID);

	  channel_descr->SoundfieldGroupLinkID = current_soundfield->MCALinkID;
	  channel_descr->MCAChannelID = channel_count++ + 1;
	  channel_descr->MCATagSymbol = (i->second.requires_prefix ? "ch" : "") + i->first;
	  channel_descr->MCATagName = i->second.tag_name;
	  channel_descr->RFC5646SpokenLanguage = language;
	  channel_descr->MCALabelDictionaryID = i->second.ul;
	  descriptor_list.push_back(reinterpret_cast<ASDCP::MXF::InterchangeObject*>(channel_descr));
	  symbol_buf.clear();
	  current_soundfield = 0;
	}
      else if ( *i == ':' )
        {
          // Limits the usage to the SLVS channel, but can easily be extended to set individual languages, or soundfield group languages
          if ( symbol_buf.compare("SLVS") != 0 ) {
            DefaultLogSink().Error("Channel specific language may only be used with SLVS tag\n");
            return false;
          }
          current_language += *i;
        }
      else if ( *i == ',' )
	{
	  if ( ! symbol_buf.empty() && ! symbol_buf.compare("-") )
	    {
	      channel_count++;
	      symbol_buf.clear();
	    }
	  else if ( ! symbol_buf.empty() )
	    {
	      mca_label_map_t::const_iterator i = labels.find(symbol_buf);

	      if ( i == labels.end() )
		{
		  DefaultLogSink().Error("Unknown symbol: '%s'\n", symbol_buf.c_str());
		  return false;
		}

	      if ( ! ul_is_an_mca_channel(i->second.ul) )
		{
		  DefaultLogSink().Error("Not a channel symbol: '%s'\n", symbol_buf.c_str());
		  return false;
		}

	      ASDCP::MXF::AudioChannelLabelSubDescriptor *channel_descr =
		new ASDCP::MXF::AudioChannelLabelSubDescriptor(dict);
	      GenRandomValue(channel_descr->MCALinkID);

	      if ( current_soundfield != 0 )
		{
		  channel_descr->SoundfieldGroupLinkID = current_soundfield->MCALinkID;
		}

	      channel_descr->MCAChannelID = channel_count++ + 1;
	      channel_descr->MCATagSymbol = (i->second.requires_prefix ? "ch" : "") + i->first;
	      channel_descr->MCATagName = i->second.tag_name;
              if ( current_language.empty() )
                {
        	  channel_descr->RFC5646SpokenLanguage = language;
                }
              else
                {
                  channel_descr->RFC5646SpokenLanguage = current_language;
                }
	      channel_descr->MCALabelDictionaryID = i->second.ul;
	      descriptor_list.push_back(reinterpret_cast<ASDCP::MXF::InterchangeObject*>(channel_descr));
	      symbol_buf.clear();
              current_language.clear();
	    }
	}
      else if ( *i == '-' || isalnum(*i) )
	{
          if ( ! current_language.empty() ) 
            {
              if ( current_language.compare(":") == 0)
                {
                  current_language.clear();
                }
              current_language += *i;
            }
          else
            {
	      symbol_buf += *i;
            }
	}
      else if ( ! isspace(*i) )
	{
	  DefaultLogSink().Error("Unexpected character '%c'.\n", *i);
	  return false;
	}
    }

  if ( ! symbol_buf.empty() && ! symbol_buf.compare("-")  )
    {
      channel_count++;
    }
  else if ( ! symbol_buf.empty() )
    {
      mca_label_map_t::const_iterator i = labels.find(symbol_buf);
      
      if ( i == labels.end() )
	{
	  DefaultLogSink().Error("Unknown symbol: '%s'\n", symbol_buf.c_str());
	  return false;
	}

      if ( ! ul_is_an_mca_channel(i->second.ul) )
	{
	  DefaultLogSink().Error("Not a channel symbol: '%s'\n", symbol_buf.c_str());
	  return false;
	}

      ASDCP::MXF::AudioChannelLabelSubDescriptor *channel_descr =
	new ASDCP::MXF::AudioChannelLabelSubDescriptor(dict);
      GenRandomValue(channel_descr->MCALinkID);

      if ( current_soundfield != 0 )
	{
	  channel_descr->SoundfieldGroupLinkID = current_soundfield->MCALinkID;
	}

      channel_descr->MCAChannelID = channel_count++ + 1;
      channel_descr->MCATagSymbol = (i->second.requires_prefix ? "ch" : "") + i->first;
      channel_descr->MCATagName = i->second.tag_name;
      channel_descr->RFC5646SpokenLanguage = language;
      channel_descr->MCALabelDictionaryID = i->second.ul;
      descriptor_list.push_back(reinterpret_cast<ASDCP::MXF::InterchangeObject*>(channel_descr));
    }

  return true;
}